

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.c
# Opt level: O0

Qiniu_Error Qiniu_FileSystem_Recorder_New(char *rootPath,Qiniu_Recorder *recorder)

{
  size_t sVar1;
  char *__dest;
  Qiniu_Error QVar2;
  char *newRootPath;
  Qiniu_Recorder *recorder_local;
  char *rootPath_local;
  
  sVar1 = strlen(rootPath);
  __dest = (char *)malloc(sVar1 + 1);
  sVar1 = strlen(rootPath);
  memset(__dest,0,sVar1 + 1);
  strcpy(__dest,rootPath);
  recorder->open = _Qiniu_FileSystem_Recorder_Open;
  recorder->remove = _Qiniu_FileSystem_Recorder_Remove;
  recorder->free = _Qiniu_FileSystem_Recorder_Free;
  recorder->data = __dest;
  QVar2._0_8_ = Qiniu_OK._0_8_ & 0xffffffff;
  QVar2.message = Qiniu_OK.message;
  return QVar2;
}

Assistant:

Qiniu_Error
Qiniu_FileSystem_Recorder_New(const char *rootPath, Qiniu_Recorder *recorder)
{
    char *newRootPath = malloc(strlen(rootPath) + 1);
    memset((void *)newRootPath, '\0', strlen(rootPath) + 1);
    strcpy(newRootPath, rootPath);

    recorder->open = _Qiniu_FileSystem_Recorder_Open;
    recorder->remove = _Qiniu_FileSystem_Recorder_Remove;
    recorder->free = _Qiniu_FileSystem_Recorder_Free;
    recorder->data = (void *)newRootPath;
    return Qiniu_OK;
}